

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall List::draw(List *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Theme *pTVar7;
  pointer pbVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined8 in_XMM1_Qa;
  undefined8 uVar12;
  undefined8 uVar13;
  SaveState state;
  undefined1 local_430 [1024];
  
  pTVar7 = ((this->super_Widget).dialog)->theme;
  al_store_state(local_430,0xffff);
  uVar12._0_4_ = (pTVar7->bg).r;
  uVar12._4_4_ = (pTVar7->bg).g;
  uVar13._0_4_ = (pTVar7->bg).b;
  uVar13._4_4_ = (pTVar7->bg).a;
  iVar9 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar9 != '\0') {
    uVar12 = al_map_rgb(0x40,0x40,0x40);
    uVar13 = in_XMM1_Qa;
  }
  al_draw_filled_rectangle
            ((float)((this->super_Widget).x1 + 1),(float)((this->super_Widget).y1 + 1),
             (float)((this->super_Widget).x2 + -1),(float)((this->super_Widget).y2 + -1),uVar12,
             uVar13);
  al_set_blender(0,1,3);
  iVar9 = al_get_font_line_height(pTVar7->font);
  if ((this->items).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->items).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar10 = 0;
    uVar11 = 0;
    do {
      iVar6 = (this->super_Widget).y1;
      iVar1 = iVar6 + iVar10;
      if ((uint)uVar11 == this->selected_item) {
        uVar3._0_4_ = (pTVar7->highlight).r;
        uVar3._4_4_ = (pTVar7->highlight).g;
        uVar4._0_4_ = (pTVar7->highlight).b;
        uVar4._4_4_ = (pTVar7->highlight).a;
        al_draw_filled_rectangle
                  ((float)((this->super_Widget).x1 + 1),(float)iVar1,
                   (float)((this->super_Widget).x2 + -1),(float)(iVar6 + iVar9 + -1 + iVar10),uVar3,
                   uVar4);
      }
      pbVar8 = (this->items).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->items).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar11) {
        uVar12 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,uVar11);
        al_restore_state(local_430);
        _Unwind_Resume(uVar12);
      }
      uVar2 = (pTVar7->fg).r;
      uVar5._0_4_ = (pTVar7->fg).b;
      uVar5._4_4_ = (pTVar7->fg).a;
      al_draw_text(uVar2,uVar5,(float)(this->super_Widget).x1,(float)iVar1,pTVar7->font,0,
                   pbVar8[uVar11]._M_dataplus._M_p);
      uVar11 = (ulong)((uint)uVar11 + 1);
      iVar10 = iVar10 + iVar9;
    } while (uVar11 < (ulong)((long)(this->items).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->items).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  al_restore_state(local_430);
  return;
}

Assistant:

void List::draw()
{
   const Theme & theme = dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1 + 1, y1 + 1, x2 - 1, y2 - 1, bg);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   const int font_height = al_get_font_line_height(theme.font);
   for (unsigned i = 0; i < items.size(); i++) {
      int yi = y1 + i * font_height;

      if (i == selected_item) {
         al_draw_filled_rectangle(x1 + 1, yi, x2 - 1, yi + font_height - 1,
            theme.highlight);
      }

      al_draw_text(theme.font, theme.fg, x1, yi, 0, items.at(i).c_str());
   }
}